

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_NanValue_Test::~FuzzTest_NanValue_Test(FuzzTest_NanValue_Test *this)

{
  FuzzTest_NanValue_Test *this_local;
  
  ~FuzzTest_NanValue_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(FuzzTest, NanValue) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             enum_type {
               value {
                 number: 0
                 options { uninterpreted_option { double_value: nan } }
               }
             }
           })pb"));
}